

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::Deconvolution_x86_avx::forward
          (Deconvolution_x86_avx *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint i;
  pointer pMVar1;
  pointer pMVar2;
  int *piVar3;
  long *plVar4;
  Deconvolution_x86_avx *pDVar5;
  Allocator *pAVar6;
  Layer *pLVar7;
  void *pvVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  Allocator *pAVar13;
  ulong uVar14;
  void *pvVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  ParamDict pd;
  ParamDict local_200;
  int local_1f0;
  int local_1ec;
  Mat local_1e8;
  Mat local_198;
  pointer local_150;
  Option *local_148;
  pointer local_140;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_138;
  Deconvolution_x86_avx *local_130;
  ModelBinFromMatArray local_128;
  Mat local_118;
  Mat local_c8;
  void *local_80;
  undefined4 uStack_78;
  undefined4 uStack_74;
  undefined8 local_70;
  int local_68;
  Allocator *local_60;
  int iStack_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  int local_48;
  size_t local_40;
  
  pMVar1 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pMVar2 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_1ec = pMVar1[1].w;
  uVar18 = pMVar1->elempack * pMVar1->c;
  local_1f0 = pMVar1[1].h;
  i = pMVar1[1].d;
  local_118.cstep = 0;
  local_118.data = (void *)0x0;
  local_118.refcount._0_4_ = 0;
  local_118.refcount._4_4_ = 0;
  local_118.elemsize._0_4_ = 0;
  local_118.elemsize._4_4_ = 0;
  local_118.elempack = 0;
  local_118.allocator = (Allocator *)0x0;
  local_118.dims = 0;
  local_118.w = 0;
  local_118.h = 0;
  local_118.d = 0;
  local_118.c = 0;
  local_138 = bottom_blobs;
  local_130 = this;
  flatten(pMVar1 + 1,&local_118,opt);
  iVar12 = -100;
  local_1e8.elemsize = CONCAT44(local_1e8.elemsize._4_4_,(undefined4)local_1e8.elemsize);
  local_118.elemsize = CONCAT44(local_118.elemsize._4_4_,(undefined4)local_118.elemsize);
  local_70 = CONCAT44(local_70._4_4_,(undefined4)local_70);
  if ((local_118.data == (void *)0x0) ||
     (local_1e8.elemsize = CONCAT44(local_1e8.elemsize._4_4_,(undefined4)local_1e8.elemsize),
     local_118.elemsize = CONCAT44(local_118.elemsize._4_4_,(undefined4)local_118.elemsize),
     local_70 = CONCAT44(local_70._4_4_,(undefined4)local_70),
     (long)local_118.c * local_118.cstep == 0)) goto LAB_0029db37;
  local_118.w = local_118.w * local_118.elempack;
  local_118.elemsize =
       CONCAT44(local_118.elemsize._4_4_,(undefined4)local_118.elemsize) /
       (ulong)(long)local_118.elempack;
  local_118.elempack = 1;
  local_198.cstep = 0;
  uVar16 = local_1f0 * local_1ec;
  local_198.data = (Allocator *)0x0;
  local_198.refcount._0_4_ = 0;
  local_198.refcount._4_4_ = 0;
  local_198.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  local_198.elempack = 0;
  local_198.allocator = (Allocator *)local_198.data;
  local_198.dims = (int)local_198.refcount;
  local_198.w = local_198.refcount._4_4_;
  local_198._48_8_ = local_198.elemsize;
  local_198.c = local_198.elempack;
  local_140 = pMVar2;
  Mat::create(&local_198,i * uVar18 * uVar16,4,opt->workspace_allocator);
  pDVar5 = local_130;
  pMVar2 = local_140;
  iVar12 = -100;
  local_1e8.elemsize = CONCAT44(local_1e8.elemsize._4_4_,(undefined4)local_1e8.elemsize);
  local_70 = CONCAT44(local_70._4_4_,(undefined4)local_70);
  if (((Allocator *)local_198.data != (Allocator *)0x0) &&
     (local_1e8.elemsize = CONCAT44(local_1e8.elemsize._4_4_,(undefined4)local_1e8.elemsize),
     local_70 = CONCAT44(local_70._4_4_,(undefined4)local_70),
     (long)local_198.c * local_198.cstep != 0)) {
    if (0 < (int)i) {
      uVar9 = (ulong)uVar16;
      uVar14 = 0;
      pAVar6 = (Allocator *)local_198.data;
      pvVar8 = local_118.data;
      do {
        if (0 < (int)uVar18) {
          uVar10 = 0;
          pAVar13 = pAVar6;
          pvVar15 = pvVar8;
          do {
            if (0 < (int)uVar16) {
              uVar17 = 0;
              do {
                *(undefined4 *)((long)&pAVar13->_vptr_Allocator + uVar17 * 4) =
                     *(undefined4 *)((long)pvVar15 + uVar17 * 4);
                uVar17 = uVar17 + 1;
              } while (uVar9 != uVar17);
            }
            uVar10 = uVar10 + 1;
            pAVar13 = (Allocator *)((long)&pAVar13->_vptr_Allocator + uVar9 * 4);
            pvVar15 = (void *)((long)pvVar15 + i * uVar9 * 4);
          } while (uVar10 != uVar18);
        }
        uVar14 = uVar14 + 1;
        pAVar6 = (Allocator *)((long)&pAVar6->_vptr_Allocator + uVar18 * uVar9 * 4);
        pvVar8 = (void *)((long)pvVar8 + uVar9 * 4);
      } while (uVar14 != i);
    }
    local_1e8.cstep = 0;
    local_1e8.data = (void *)0x0;
    local_1e8.refcount._0_4_ = 0;
    local_1e8.refcount._4_4_ = 0;
    local_1e8.elemsize._0_4_ = 0;
    local_1e8.elemsize._4_4_ = 0;
    local_1e8.elemsize = 0;
    local_1e8.elempack = 0;
    local_1e8.allocator = (Allocator *)0x0;
    local_1e8.dims = 0;
    local_1e8.w = 0;
    local_1e8.h = 0;
    local_1e8.d = 0;
    local_1e8.c = 0;
    local_150 = pMVar1;
    local_148 = opt;
    if ((local_130->super_Deconvolution).bias_term == 0) {
LAB_0029d66b:
      pLVar7 = create_layer_cpu(8);
      ParamDict::ParamDict(&local_200);
      ParamDict::set(&local_200,0,i);
      ParamDict::set(&local_200,1,local_1ec);
      ParamDict::set(&local_200,0xb,local_1f0);
      ParamDict::set(&local_200,2,(pDVar5->super_Deconvolution).dilation_w);
      ParamDict::set(&local_200,0xc,(pDVar5->super_Deconvolution).dilation_h);
      ParamDict::set(&local_200,3,(pDVar5->super_Deconvolution).stride_w);
      ParamDict::set(&local_200,0xd,(pDVar5->super_Deconvolution).stride_h);
      ParamDict::set(&local_200,4,(pDVar5->super_Deconvolution).pad_left);
      ParamDict::set(&local_200,0xf,(pDVar5->super_Deconvolution).pad_right);
      ParamDict::set(&local_200,0xe,(pDVar5->super_Deconvolution).pad_top);
      ParamDict::set(&local_200,0x10,(pDVar5->super_Deconvolution).pad_bottom);
      ParamDict::set(&local_200,0x12,(pDVar5->super_Deconvolution).output_pad_right);
      ParamDict::set(&local_200,0x13,(pDVar5->super_Deconvolution).output_pad_bottom);
      ParamDict::set(&local_200,0x14,(pDVar5->super_Deconvolution).output_w);
      ParamDict::set(&local_200,0x15,(pDVar5->super_Deconvolution).output_h);
      ParamDict::set(&local_200,5,(pDVar5->super_Deconvolution).bias_term);
      ParamDict::set(&local_200,6,local_198.w);
      ParamDict::set(&local_200,9,(pDVar5->super_Deconvolution).activation_type);
      ParamDict::set(&local_200,10,&(pDVar5->super_Deconvolution).activation_params);
      (*pLVar7->_vptr_Layer[2])(pLVar7,&local_200);
      piVar3 = (int *)CONCAT44(local_198.refcount._4_4_,(int)local_198.refcount);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
      local_c8.elemsize._0_4_ = (undefined4)local_198.elemsize;
      local_c8.elemsize._4_4_ = (undefined4)(local_198.elemsize >> 0x20);
      local_c8.h = local_198.h;
      local_c8.d = local_198.d;
      piVar3 = (int *)CONCAT44(local_1e8.refcount._4_4_,local_1e8.refcount._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
      local_c8.cstep = local_198.cstep;
      local_c8.c = local_198.c;
      local_c8.w = local_198.w;
      local_c8.dims = local_198.dims;
      local_c8.allocator = local_198.allocator;
      local_c8.elempack = local_198.elempack;
      local_c8.refcount._4_4_ = local_198.refcount._4_4_;
      local_c8.refcount._0_4_ = (int)local_198.refcount;
      local_c8.data = local_198.data;
      local_70 = local_1e8.elemsize;
      local_80 = local_1e8.data;
      uStack_78 = local_1e8.refcount._0_4_;
      uStack_74 = local_1e8.refcount._4_4_;
      local_68 = local_1e8.elempack;
      local_60 = local_1e8.allocator;
      iStack_58 = local_1e8.dims;
      iStack_54 = local_1e8.w;
      iStack_50 = local_1e8.h;
      iStack_4c = local_1e8.d;
      local_48 = local_1e8.c;
      local_40 = local_1e8.cstep;
      ModelBinFromMatArray::ModelBinFromMatArray(&local_128,&local_c8);
      (*pLVar7->_vptr_Layer[3])(pLVar7,&local_128);
      ModelBinFromMatArray::~ModelBinFromMatArray(&local_128);
      (*pLVar7->_vptr_Layer[4])(pLVar7,opt);
      (*pLVar7->_vptr_Layer[7])(pLVar7,pMVar1,pMVar2,opt);
      (*pLVar7->_vptr_Layer[5])(pLVar7,opt);
      (*pLVar7->_vptr_Layer[1])(pLVar7);
      lVar11 = 0x48;
      do {
        piVar3 = *(int **)((long)&local_c8.refcount + lVar11);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            pvVar8 = *(void **)((long)&local_c8.data + lVar11);
            plVar4 = *(long **)((long)&local_c8.allocator + lVar11);
            if (plVar4 == (long *)0x0) {
              if (pvVar8 != (void *)0x0) {
                free(pvVar8);
              }
            }
            else {
              (**(code **)(*plVar4 + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)&local_c8.cstep + lVar11) = 0;
        *(undefined8 *)((long)&local_c8.refcount + lVar11 + 4) = 0;
        *(undefined8 *)((long)&local_c8.elemsize + lVar11 + 4) = 0;
        *(undefined8 *)((long)&local_c8.data + lVar11) = 0;
        *(undefined8 *)((long)&local_c8.refcount + lVar11) = 0;
        *(undefined8 *)((long)&local_c8.dims + lVar11) = 0;
        *(undefined8 *)((long)&local_c8.h + lVar11) = 0;
        *(undefined4 *)((long)&local_c8.c + lVar11) = 0;
        lVar11 = lVar11 + -0x48;
      } while (lVar11 != -0x48);
      ParamDict::~ParamDict(&local_200);
      iVar12 = 0;
    }
    else {
      flatten((local_138->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start + 2,&local_1e8,opt);
      iVar12 = -100;
      local_1e8.elemsize = CONCAT44(local_1e8.elemsize._4_4_,(undefined4)local_1e8.elemsize);
      local_70 = CONCAT44(local_70._4_4_,(undefined4)local_70);
      if ((local_1e8.data != (void *)0x0) &&
         (local_1e8.elemsize = CONCAT44(local_1e8.elemsize._4_4_,(undefined4)local_1e8.elemsize),
         local_70 = CONCAT44(local_70._4_4_,(undefined4)local_70),
         (long)local_1e8.c * local_1e8.cstep != 0)) {
        local_1e8.w = local_1e8.w * local_1e8.elempack;
        local_1e8.elemsize =
             CONCAT44(local_1e8.elemsize._4_4_,(undefined4)local_1e8.elemsize) /
             (ulong)(long)local_1e8.elempack;
        local_1e8.elempack = 1;
        goto LAB_0029d66b;
      }
    }
    piVar3 = (int *)CONCAT44(local_1e8.refcount._4_4_,local_1e8.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (local_1e8.allocator == (Allocator *)0x0) {
          if (local_1e8.data != (void *)0x0) {
            free(local_1e8.data);
          }
        }
        else {
          (*(local_1e8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  piVar3 = (int *)CONCAT44(local_198.refcount._4_4_,(int)local_198.refcount);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_198.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_198.data != (Allocator *)0x0) {
          free(local_198.data);
        }
      }
      else {
        (*(local_198.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_0029db37:
  piVar3 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_118.allocator == (Allocator *)0x0) {
        if (local_118.data != (void *)0x0) {
          free(local_118.data);
        }
      }
      else {
        (*(local_118.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar12;
}

Assistant:

int Deconvolution_x86_avx::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& _weight_data = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    const int _num_input = bottom_blob.c * bottom_blob.elempack;
    const int _kernel_w = _weight_data.w;
    const int _kernel_h = _weight_data.h;
    const int _num_output = _weight_data.d * 1;

    Mat weight_data_flattened;
    flatten(_weight_data, weight_data_flattened, opt);
    if (weight_data_flattened.empty())
        return -100;

    // weight_data_flattened as pack1
    weight_data_flattened.w *= weight_data_flattened.elempack;
    weight_data_flattened.elemsize /= weight_data_flattened.elempack;
    weight_data_flattened.elempack = 1;

    // transpose group-inch/group-outch/group-kh-kw to group-outch/group-inch/group-kh-kw
    Mat weight_data_transposed;
    {
        weight_data_transposed.create(_kernel_w * _kernel_h * _num_output * _num_input / 1, 4u, opt.workspace_allocator);
        if (weight_data_transposed.empty())
            return -100;

        const int outch_g = _num_output / 1;
        const int inch_g = _num_input / 1;
        const int maxk = _kernel_h * _kernel_w;

        for (int g = 0; g < 1; g++)
        {
            // reorder weight from inch-outch to outch-inch
            float* wg2 = (float*)weight_data_transposed + g * outch_g * inch_g * maxk;
            const float* wg = (const float*)weight_data_flattened + g * inch_g * outch_g * maxk;
            for (int i = 0; i < outch_g; i++)
            {
                for (int j = 0; j < inch_g; j++)
                {
                    for (int k = 0; k < maxk; k++)
                    {
                        wg2[(i * inch_g + j) * maxk + k] = wg[(j * outch_g + i) * maxk + k];
                    }
                }
            }
        }
    }

    Mat bias_data_flattened;
    if (bias_term)
    {
        const Mat& _bias_data = bottom_blobs[2];
        flatten(_bias_data, bias_data_flattened, opt);
        if (bias_data_flattened.empty())
            return -100;

        // bias_data_flattened as pack1
        bias_data_flattened.w *= bias_data_flattened.elempack;
        bias_data_flattened.elemsize /= bias_data_flattened.elempack;
        bias_data_flattened.elempack = 1;
    }

    ncnn::Layer* op = ncnn::create_layer_cpu(ncnn::LayerType::Deconvolution);

    ncnn::ParamDict pd;
    pd.set(0, _num_output);
    pd.set(1, _kernel_w);
    pd.set(11, _kernel_h);
    pd.set(2, dilation_w);
    pd.set(12, dilation_h);
    pd.set(3, stride_w);
    pd.set(13, stride_h);
    pd.set(4, pad_left);
    pd.set(15, pad_right);
    pd.set(14, pad_top);
    pd.set(16, pad_bottom);
    pd.set(18, output_pad_right);
    pd.set(19, output_pad_bottom);
    pd.set(20, output_w);
    pd.set(21, output_h);
    pd.set(5, bias_term);
    pd.set(6, weight_data_transposed.w);
    pd.set(9, activation_type);
    pd.set(10, activation_params);

    op->load_param(pd);

    ncnn::Mat weights[2];
    weights[0] = weight_data_transposed;
    weights[1] = bias_data_flattened;

    op->load_model(ncnn::ModelBinFromMatArray(weights));

    op->create_pipeline(opt);

    op->forward(bottom_blob, top_blob, opt);

    op->destroy_pipeline(opt);

    delete op;

    return 0;
}